

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O0

void HTS_PStreamSet_clear(HTS_PStreamSet *pss)

{
  HTS_PStreamSet *in_RDI;
  HTS_PStream *pstream;
  size_t j;
  size_t i;
  size_t in_stack_ffffffffffffffd8;
  HTS_PStream *p;
  ulong local_18;
  ulong local_10;
  
  if (in_RDI->pstream != (HTS_PStream *)0x0) {
    for (local_10 = 0; local_10 < in_RDI->nstream; local_10 = local_10 + 1) {
      p = in_RDI->pstream + local_10;
      if ((p->sm).wum != (double *)0x0) {
        HTS_free((void *)0x20e918);
      }
      if ((p->sm).g != (double *)0x0) {
        HTS_free((void *)0x20e932);
      }
      if ((p->sm).wuw != (double **)0x0) {
        HTS_free_matrix((double **)p,in_stack_ffffffffffffffd8);
      }
      if ((p->sm).ivar != (double **)0x0) {
        HTS_free_matrix((double **)p,in_stack_ffffffffffffffd8);
      }
      if ((p->sm).mean != (double **)0x0) {
        HTS_free_matrix((double **)p,in_stack_ffffffffffffffd8);
      }
      if (p->par != (double **)0x0) {
        HTS_free_matrix((double **)p,in_stack_ffffffffffffffd8);
      }
      if (p->msd_flag != (HTS_Boolean *)0x0) {
        HTS_free((void *)0x20e9d8);
      }
      if (p->win_coefficient != (double **)0x0) {
        for (local_18 = 0; local_18 < p->win_size; local_18 = local_18 + 1) {
          p->win_coefficient[local_18] = p->win_coefficient[local_18] + p->win_l_width[local_18];
          HTS_free((void *)0x20ea45);
        }
      }
      if (p->gv_mean != (double *)0x0) {
        HTS_free((void *)0x20ea71);
      }
      if (p->gv_vari != (double *)0x0) {
        HTS_free((void *)0x20ea8b);
      }
      if (p->win_coefficient != (double **)0x0) {
        HTS_free((void *)0x20eaa5);
      }
      if (p->win_l_width != (int *)0x0) {
        HTS_free((void *)0x20eabf);
      }
      if (p->win_r_width != (int *)0x0) {
        HTS_free((void *)0x20ead9);
      }
      if (p->gv_switch != (HTS_Boolean *)0x0) {
        HTS_free((void *)0x20eaf9);
      }
    }
    HTS_free((void *)0x20eb1b);
  }
  HTS_PStreamSet_initialize(in_RDI);
  return;
}

Assistant:

void HTS_PStreamSet_clear(HTS_PStreamSet * pss)
{
   size_t i, j;
   HTS_PStream *pstream;

   if (pss->pstream) {
      for (i = 0; i < pss->nstream; i++) {
         pstream = &pss->pstream[i];
         if (pstream->sm.wum)
            HTS_free(pstream->sm.wum);
         if (pstream->sm.g)
            HTS_free(pstream->sm.g);
         if (pstream->sm.wuw)
            HTS_free_matrix(pstream->sm.wuw, pstream->length);
         if (pstream->sm.ivar)
            HTS_free_matrix(pstream->sm.ivar, pstream->length);
         if (pstream->sm.mean)
            HTS_free_matrix(pstream->sm.mean, pstream->length);
         if (pstream->par)
            HTS_free_matrix(pstream->par, pstream->length);
         if (pstream->msd_flag)
            HTS_free(pstream->msd_flag);
         if (pstream->win_coefficient) {
            for (j = 0; j < pstream->win_size; j++) {
               pstream->win_coefficient[j] += pstream->win_l_width[j];
               HTS_free(pstream->win_coefficient[j]);
            }
         }
         if (pstream->gv_mean)
            HTS_free(pstream->gv_mean);
         if (pstream->gv_vari)
            HTS_free(pstream->gv_vari);
         if (pstream->win_coefficient)
            HTS_free(pstream->win_coefficient);
         if (pstream->win_l_width)
            HTS_free(pstream->win_l_width);
         if (pstream->win_r_width)
            HTS_free(pstream->win_r_width);
         if (pstream->gv_switch)
            HTS_free(pstream->gv_switch);
      }
      HTS_free(pss->pstream);
   }
   HTS_PStreamSet_initialize(pss);
}